

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O3

LY_ERR ly_err_new(ly_err_item **err,LY_ERR ecode,LY_VECODE vecode,char *data_path,char *apptag,
                 char *err_format,...)

{
  ly_err_item *plVar1;
  char in_AL;
  int iVar2;
  ly_err_item *plVar3;
  ly_err_item **pplVar4;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *msg;
  va_list print_args;
  char *local_118;
  char *local_110;
  undefined8 local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [48];
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_118 = (char *)0x0;
  if (ecode != LY_SUCCESS && err != (ly_err_item **)0x0) {
    local_110 = err_format;
    plVar3 = (ly_err_item *)calloc(1,0x48);
    if (plVar3 == (ly_err_item *)0x0) {
      ecode = LY_EMEM;
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_err_new");
    }
    else {
      if (*err == (ly_err_item *)0x0) {
        pplVar4 = &plVar3->prev;
      }
      else {
        plVar1 = (*err)->prev;
        plVar3->prev = plVar1;
        pplVar4 = &plVar1->next;
      }
      *pplVar4 = plVar3;
      plVar3->err = ecode;
      plVar3->vecode = vecode;
      plVar3->data_path = data_path;
      plVar3->apptag = apptag;
      if (local_110 == (char *)0x0) {
        local_118 = (char *)0x0;
      }
      else {
        local_f8 = local_e8;
        local_100 = &stack0x00000008;
        local_108 = 0x3000000030;
        iVar2 = vasprintf(&local_118,local_110,&local_108);
        if (iVar2 == -1) {
          local_118 = (char *)0x0;
        }
      }
      plVar3->msg = local_118;
      if (*err == (ly_err_item *)0x0) {
        *err = plVar3;
      }
      ecode = plVar3->err;
    }
  }
  return ecode;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_err_new(struct ly_err_item **err, LY_ERR ecode, LY_VECODE vecode, char *data_path, char *apptag,
        const char *err_format, ...)
{
    char *msg = NULL;
    struct ly_err_item *e;

    if (!err || (ecode == LY_SUCCESS)) {
        /* nothing to do */
        return ecode;
    }

    e = calloc(1, sizeof *e);
    LY_CHECK_ERR_RET(!e, LOGMEM(NULL), LY_EMEM);

    e->prev = (*err) ? (*err)->prev : e;
    if (*err) {
        (*err)->prev->next = e;
    }

    /* fill in the information */
    e->level = LY_LLERR;
    e->err = ecode;
    e->vecode = vecode;
    e->data_path = data_path;
    e->apptag = apptag;

    if (err_format) {
        va_list print_args;

        va_start(print_args, err_format);

        if (vasprintf(&msg, err_format, print_args) == -1) {
            /* we don't have anything more to do, just set msg to NULL to avoid undefined content,
             * still keep the information about the original error instead of LY_EMEM or other printf's error */
            msg = NULL;
        }

        va_end(print_args);
    }
    e->msg = msg;

    if (!(*err)) {
        *err = e;
    }

    return e->err;
}